

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::Transpose
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *T)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long local_60;
  
  iVar2 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar3 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
  lVar1 = (this->fBlockSize).fNElements;
  if (0 < lVar1) {
    lVar5 = 0;
    local_60 = 0;
    do {
      lVar9 = (long)(this->fBlockSize).fStore[lVar5];
      if (0 < lVar9) {
        lVar6 = (this->fBlockPos).fStore[lVar5] << 3;
        lVar4 = 0;
        do {
          lVar7 = lVar6;
          lVar8 = local_60;
          lVar10 = lVar9;
          do {
            (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (T,local_60 + lVar4,lVar8,(long)&((this->fStorage).fStore)->_M_value + lVar7);
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 8;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
          lVar4 = lVar4 + 1;
          lVar6 = lVar6 + lVar9 * 8;
        } while (lVar4 != lVar9);
      }
      local_60 = local_60 + lVar9;
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar1);
  }
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Transpose (TPZMatrix<TVar> *const T) const
{
	T->Resize( Dim(), Dim() );
	
	int64_t b, eq = 0, pos;
	int bsize, r, c;
	int64_t nb = fBlockSize.NElements();
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				T->PutVal(eq+r,eq+c,fStorage[pos+c+r*bsize]);
			}
		}
		eq += bsize;
	}
}